

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O1

Shr_Man_t * Shr_ManAlloc(Gia_Man_t *pGia)

{
  int nObjsMax;
  char *pcVar1;
  Shr_Man_t *pSVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Gia_Man_t *pGVar7;
  size_t sVar8;
  char *pcVar9;
  Bdc_Man_t *pBVar10;
  Rsb_Man_t *pRVar11;
  int iVar12;
  
  pSVar2 = (Shr_Man_t *)calloc(1,0x80);
  pSVar2->nDivMax = 0x40;
  pSVar2->nNewSize = pGia->nObjs * 2;
  pSVar2->pGia = pGia;
  pVVar3 = (Vec_Wrd_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  pwVar4 = (word *)malloc(8000);
  pVVar3->pArray = pwVar4;
  pSVar2->vFanMem = pVVar3;
  Vec_WrdPush(pVVar3,0xffffffffffffffff);
  nObjsMax = pSVar2->nNewSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < nObjsMax - 1U) {
    iVar12 = nObjsMax;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar12;
  if (iVar12 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar12 * 4);
  }
  pVVar5->pArray = piVar6;
  pVVar5->nSize = nObjsMax;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0,(long)nObjsMax * 4);
  }
  pSVar2->vObj2Fan = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  pSVar2->vDivs = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  pSVar2->vPrio = pVVar5;
  pVVar3 = (Vec_Wrd_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar12;
  if (iVar12 == 0) {
    pwVar4 = (word *)0x0;
  }
  else {
    pwVar4 = (word *)malloc((long)iVar12 << 3);
  }
  pVVar3->pArray = pwVar4;
  pVVar3->nSize = nObjsMax;
  pcVar9 = (char *)0x0;
  memset(pwVar4,0,(long)nObjsMax << 3);
  pSVar2->vTruths = pVVar3;
  pVVar3 = (Vec_Wrd_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  pwVar4 = (word *)malloc(800);
  pVVar3->pArray = pwVar4;
  pSVar2->vDivTruths = pVVar3;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  pVVar5->pArray = piVar6;
  pSVar2->vDivResub = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  pVVar5->pArray = piVar6;
  pSVar2->vLeaves = pVVar5;
  pGVar7 = Gia_ManStart(nObjsMax);
  pSVar2->pNew = pGVar7;
  pcVar1 = pGia->pName;
  if (pcVar1 != (char *)0x0) {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  pGVar7->pName = pcVar9;
  pcVar1 = pGia->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  pGVar7->pSpec = pcVar9;
  Gia_ManHashAlloc(pGVar7);
  Gia_ManCleanLevels(pSVar2->pNew,pSVar2->nNewSize);
  pGVar7 = pSVar2->pNew;
  pGVar7->nObjs = pSVar2->nNewSize;
  Gia_ManIncrementTravId(pGVar7);
  pSVar2->pNew->nObjs = 1;
  (pSVar2->Pars).nVarsMax = 6;
  (pSVar2->Pars).fVerbose = 0;
  pBVar10 = Bdc_ManAlloc(&pSVar2->Pars);
  pSVar2->pManDec = pBVar10;
  pRVar11 = Rsb_ManAlloc(6,pSVar2->nDivMax,4,1);
  pSVar2->pManRsb = pRVar11;
  return pSVar2;
}

Assistant:

Shr_Man_t * Shr_ManAlloc( Gia_Man_t * pGia )
{
    Shr_Man_t * p;
    p = ABC_CALLOC( Shr_Man_t, 1 );
    p->nDivMax     = 64;
    p->nNewSize    = 2 * Gia_ManObjNum(pGia);
    p->pGia        = pGia;
    p->vFanMem     = Vec_WrdAlloc( 1000 );   Vec_WrdPush(p->vFanMem, -1); 
    p->vObj2Fan    = Vec_IntStart( p->nNewSize );
    p->vDivs       = Vec_IntAlloc( 1000 );
    p->vPrio       = Vec_IntAlloc( 1000 );
    p->vTruths     = Vec_WrdStart( p->nNewSize );
    p->vDivTruths  = Vec_WrdAlloc( 100 );
    p->vDivResub   = Vec_IntAlloc( 6 );
    p->vLeaves     = Vec_IntAlloc( 6 );
    // start new manager
    p->pNew        = Gia_ManStart( p->nNewSize );
    p->pNew->pName = Abc_UtilStrsav( pGia->pName );
    p->pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashAlloc( p->pNew );
    Gia_ManCleanLevels( p->pNew, p->nNewSize );
    // allocate traversal IDs
    p->pNew->nObjs = p->nNewSize;
    Gia_ManIncrementTravId( p->pNew );
    p->pNew->nObjs = 1;
    // start decompostion
    p->Pars.nVarsMax = 6;
    p->Pars.fVerbose = 0;
    p->pManDec = Bdc_ManAlloc( &p->Pars );
    p->pManRsb = Rsb_ManAlloc( 6, p->nDivMax, 4, 1 );
    return p;
}